

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)

{
  char *__s;
  size_t __n;
  size_t __n_00;
  
  __n = (ulong)ctx->indent * (long)ctx->level;
  __s = ctx->p;
  if (ctx->pflush < __s + __n) {
    if (ctx->pflush <= __s) {
      (*ctx->flush)(ctx,0);
    }
    __n_00 = (long)ctx->pflush - (long)ctx->p;
    if (__n_00 < __n) {
      do {
        memset(ctx->p,0x20,__n_00);
        ctx->p = ctx->p + __n_00;
        __n = __n - __n_00;
        (*ctx->flush)(ctx,0);
        __n_00 = (long)ctx->pflush - (long)ctx->p;
      } while (__n_00 < __n);
    }
    __s = ctx->p;
  }
  memset(__s,0x20,__n);
  ctx->p = ctx->p + __n;
  return;
}

Assistant:

void flatcc_json_printer_indent(flatcc_json_printer_t *ctx)
{
    /*
     * This is only needed when indent is 0 but helps external users
     * to avoid flushing when indenting.
     */
    print_indent(ctx);
}